

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

void __thiscall
QNetworkReplyImplPrivate::appendDownstreamDataSignalEmissions(QNetworkReplyImplPrivate *this)

{
  QNetworkReply *this_00;
  char cVar1;
  long lVar2;
  longlong _t2;
  qint64 qVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  optional<long_long> oVar5;
  QByteArrayView value;
  undefined1 local_40 [16];
  undefined1 *puStack_30;
  QHttpHeaders local_20;
  
  local_20.d.d.ptr =
       (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)
       ((totally_ordered_wrapper<QHttpHeadersPrivate_*> *)(in_FS_OFFSET + 0x28))->ptr;
  this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)local_40);
  QVar4 = QHttpHeaders::value((QHttpHeaders *)local_40,ContentLength,(QByteArrayView)ZEXT816(0));
  value.m_data = QVar4.m_data;
  value.m_size = (qsizetype)value.m_data;
  oVar5 = QNetworkHeadersPrivate::toInt((QNetworkHeadersPrivate *)QVar4.m_size,value);
  local_40._8_8_ =
       oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long>._M_payload;
  puStack_30 = (undefined1 *)
               CONCAT71(puStack_30._1_7_,
                        oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
                        super__Optional_payload_base<long_long>._M_engaged);
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)local_40);
  this->notificationHandlingPaused = true;
  QIODevice::readyRead();
  cVar1 = QElapsedTimer::isValid();
  if (cVar1 != '\0') {
    lVar2 = QElapsedTimer::elapsed();
    if (99 < lVar2) {
      QElapsedTimer::start();
      qVar3 = this->bytesDownloaded;
      local_40._0_4_ = -1;
      _t2 = std::optional<long_long>::value_or<int>
                      ((optional<long_long> *)(local_40 + 8),(int *)local_40);
      QNetworkReply::downloadProgress(this_00,qVar3,_t2);
    }
  }
  resumeNotificationHandling(this);
  qVar3 = nextDownstreamBlockSize(this);
  if (0 < qVar3) {
    backendNotify(this,NotifyDownstreamReadyWrite);
  }
  if ((QExplicitlySharedDataPointer<QHttpHeadersPrivate>)
      ((totally_ordered_wrapper<QHttpHeadersPrivate_*> *)(in_FS_OFFSET + 0x28))->ptr ==
      local_20.d.d.ptr) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::appendDownstreamDataSignalEmissions()
{
    Q_Q(QNetworkReplyImpl);

    const auto totalSizeOpt = QNetworkHeadersPrivate::toInt(
            headers().value(QHttpHeaders::WellKnownHeader::ContentLength));
    pauseNotificationHandling();
    // important: At the point of this readyRead(), the data parameter list must be empty,
    // else implicit sharing will trigger memcpy when the user is reading data!
    emit q->readyRead();
    // emit readyRead before downloadProgress in case this will cause events to be
    // processed and we get into a recursive call (as in QProgressDialog).
    if (downloadProgressSignalChoke.isValid() &&
        downloadProgressSignalChoke.elapsed() >= progressSignalInterval) {
        downloadProgressSignalChoke.start();
        emit q->downloadProgress(bytesDownloaded, totalSizeOpt.value_or(-1));
    }

    resumeNotificationHandling();
    // do we still have room in the buffer?
    if (nextDownstreamBlockSize() > 0)
        backendNotify(QNetworkReplyImplPrivate::NotifyDownstreamReadyWrite);
}